

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCoordinatesTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::TessCoordTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TessCoordTestInstance *this)

{
  pointer *coords;
  void **ppvVar1;
  SpacingMode SVar2;
  pointer pVVar3;
  pointer pVVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var5;
  undefined8 *puVar6;
  int *piVar7;
  TestLog *log;
  bool bVar8;
  undefined8 uVar9;
  pointer pTVar10;
  VkDeviceSize size;
  undefined8 renderPass;
  undefined8 pipelineLayout;
  Allocation *pAVar11;
  undefined8 obj;
  bool bVar12;
  bool bVar13;
  deUint32 dVar14;
  int iVar15;
  int iVar16;
  DeviceInterface *pDVar17;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *pDVar18;
  DescriptorPoolBuilder *pDVar19;
  DescriptorSetUpdateBuilder *pDVar20;
  const_iterator cVar21;
  GraphicsPipelineBuilder *pGVar22;
  TestLog *pTVar23;
  TessPrimitiveType TVar24;
  ulong uVar25;
  pointer pvVar26;
  Surface *pSVar27;
  pointer pvVar28;
  void *__buf;
  void *__buf_00;
  float *outerLevels;
  VkDevice device;
  pointer pvVar29;
  size_type sVar30;
  int j;
  int iVar31;
  long lVar32;
  ulong uVar33;
  int tessLevelCaseNdx;
  long lVar34;
  vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
  tessLevelCases;
  key_type local_688;
  key_type local_668;
  long local_648;
  VkDeviceSize local_640;
  VkCommandBuffer local_638;
  long *plStack_630;
  VkAccessFlags local_628;
  VkAccessFlags VStack_624;
  deUint32 dStack_620;
  deUint32 dStack_61c;
  TestStatus *local_610;
  int local_608;
  TessPrimitiveType local_604;
  DeviceInterface *local_600;
  VkDevice local_5f8;
  size_type local_5f0;
  VkBufferMemoryBarrier shaderWriteBarrier;
  TextureFormat local_5a8;
  ios_base local_570 [132];
  deUint32 local_4ec;
  bool local_4e8;
  VkPrimitiveTopology local_4e4;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> resultTessCoords;
  long local_448;
  long *plStack_440;
  VkAccessFlags local_438;
  VkAccessFlags VStack_434;
  deUint32 dStack_430;
  deUint32 dStack_42c;
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  allReferenceTessCoords;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_400;
  VkQueue local_3e0;
  size_type local_3d8;
  ulong local_3d0;
  int inner;
  int iStack_3c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  _Alloc_hider local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398 [6];
  Surface resVisual;
  Surface refVisual;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_300;
  VkDescriptorSetLayout local_2e8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_2e0;
  Buffer resultBuffer;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_290;
  VkCommandPool local_278;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_270;
  VkFramebuffer local_258;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_250;
  VkDescriptorPool local_238;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_230;
  Buffer tessLevelsBuffer;
  VkDescriptorBufferInfo resultBufferInfo;
  VkDescriptorBufferInfo tessLevelsBufferInfo;
  int outer [3];
  int iStack_1ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  
  local_610 = __return_storage_ptr__;
  pDVar17 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  local_5f8 = Context::getDevice((this->super_TestInstance).m_context);
  local_3e0 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar14 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  SVar2 = this->m_spacingMode;
  local_648 = CONCAT44(local_648._4_4_,dVar14);
  local_600 = pDVar17;
  if (SVar2 == SPACINGMODE_EQUAL) {
    std::vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>::
    vector<vkt::tessellation::TessLevels_const*,void>
              ((vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>
                *)&tessLevelCases,
               (TessLevels *)
               tessellation::(anonymous_namespace)::
               genTessLevelCases(vkt::tessellation::TessPrimitiveType,vkt::tessellation::SpacingMode)
               ::rawTessLevelCases,(TessLevels *)"winding",(allocator_type *)&shaderWriteBarrier);
  }
  else {
    TVar24 = this->m_primitiveType;
    tessLevelCases.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tessLevelCases.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tessLevelCases.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
    reserve(&tessLevelCases,9);
    lVar34 = 0;
    do {
      shaderWriteBarrier._16_8_ =
           *(undefined8 *)
            (tessellation::(anonymous_namespace)::
             genTessLevelCases(vkt::tessellation::TessPrimitiveType,vkt::tessellation::SpacingMode)
             ::rawTessLevelCases + lVar34 * 0x18 + 0x10);
      shaderWriteBarrier._0_8_ =
           *(undefined8 *)
            (tessellation::(anonymous_namespace)::
             genTessLevelCases(vkt::tessellation::TessPrimitiveType,vkt::tessellation::SpacingMode)
             ::rawTessLevelCases + lVar34 * 0x18);
      shaderWriteBarrier.pNext =
           *(void **)(tessellation::(anonymous_namespace)::
                      genTessLevelCases(vkt::tessellation::TessPrimitiveType,vkt::tessellation::SpacingMode)
                      ::rawTessLevelCases + lVar34 * 0x18 + 8);
      lVar32 = 0;
      do {
        iVar15 = getClampedRoundedTessLevel(SVar2,(float)(&shaderWriteBarrier.sType)[lVar32]);
        (&shaderWriteBarrier.sType)[lVar32] = (VkStructureType)(float)iVar15;
        lVar32 = lVar32 + 1;
      } while (lVar32 == 1);
      lVar32 = 2;
      do {
        iVar15 = getClampedRoundedTessLevel(SVar2,(float)(&shaderWriteBarrier.sType)[lVar32]);
        (&shaderWriteBarrier.sType)[lVar32] = (VkStructureType)(float)iVar15;
        lVar32 = lVar32 + 1;
      } while (lVar32 != 6);
      if (TVar24 == TESSPRIMITIVETYPE_TRIANGLES) {
        if ((((1.0 < shaderWriteBarrier.pNext._0_4_) || (1.0 < shaderWriteBarrier.pNext._4_4_)) ||
            (1.0 < (float)shaderWriteBarrier.srcAccessMask)) &&
           (((float)shaderWriteBarrier.sType == 1.0 && (!NAN((float)shaderWriteBarrier.sType))))) {
          iVar15 = getClampedRoundedTessLevel(SVar2,(float)shaderWriteBarrier.sType + 0.1);
          shaderWriteBarrier.sType = (VkStructureType)(float)iVar15;
        }
      }
      else if ((TVar24 == TESSPRIMITIVETYPE_QUADS) &&
              (((1.0 < shaderWriteBarrier.pNext._0_4_ || (1.0 < shaderWriteBarrier.pNext._4_4_)) ||
               ((1.0 < (float)shaderWriteBarrier.srcAccessMask ||
                (1.0 < (float)shaderWriteBarrier.dstAccessMask)))))) {
        if (((float)shaderWriteBarrier.sType == 1.0) && (!NAN((float)shaderWriteBarrier.sType))) {
          iVar15 = getClampedRoundedTessLevel(SVar2,(float)shaderWriteBarrier.sType + 0.1);
          shaderWriteBarrier.sType = (VkStructureType)(float)iVar15;
        }
        if (((float)shaderWriteBarrier._4_4_ == 1.0) && (!NAN((float)shaderWriteBarrier._4_4_))) {
          iVar15 = getClampedRoundedTessLevel(SVar2,(float)shaderWriteBarrier._4_4_ + 0.1);
          shaderWriteBarrier._4_4_ = (float)iVar15;
        }
      }
      if (tessLevelCases.
          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          tessLevelCases.
          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>::
        _M_realloc_insert<vkt::tessellation::TessLevels_const&>
                  ((vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>
                    *)&tessLevelCases,
                   (iterator)
                   tessLevelCases.
                   super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(TessLevels *)&shaderWriteBarrier);
      }
      else {
        (tessLevelCases.
         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_finish)->outer[2] =
             (float)shaderWriteBarrier.srcAccessMask;
        (tessLevelCases.
         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_finish)->outer[3] =
             (float)shaderWriteBarrier.dstAccessMask;
        (tessLevelCases.
         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_finish)->inner[0] = (float)shaderWriteBarrier.sType;
        (tessLevelCases.
         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_finish)->inner[1] = (float)shaderWriteBarrier._4_4_;
        *(void **)(tessLevelCases.
                   super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->outer = shaderWriteBarrier.pNext;
        tessLevelCases.
        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             tessLevelCases.
             super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      lVar34 = lVar34 + 1;
    } while (lVar34 != 9);
  }
  std::
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  ::vector(&allReferenceTessCoords,
           ((long)tessLevelCases.
                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)tessLevelCases.
                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)&shaderWriteBarrier);
  if (tessLevelCases.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      tessLevelCases.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar25 = 0;
    uVar33 = 1;
    do {
      pTVar10 = tessLevelCases.
                super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_start;
      TVar24 = this->m_primitiveType;
      SVar2 = this->m_spacingMode;
      outerLevels = tessLevelCases.
                    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar25].outer;
      bVar12 = isPatchDiscarded(TVar24,outerLevels);
      if (bVar12) {
LAB_0076d8f3:
        shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        shaderWriteBarrier._4_4_ = 0;
        shaderWriteBarrier.pNext = (void *)0x0;
        shaderWriteBarrier.srcAccessMask = 0;
        shaderWriteBarrier.dstAccessMask = 0;
      }
      else if (TVar24 == TESSPRIMITIVETYPE_ISOLINES) {
        getClampedRoundedIsolineTessLevels(SVar2,outerLevels,outer);
        generateReferenceIsolineTessCoords
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                   &shaderWriteBarrier,outer[0],outer[1]);
      }
      else if (TVar24 == TESSPRIMITIVETYPE_QUADS) {
        getClampedRoundedQuadTessLevels(SVar2,pTVar10[uVar25].inner,outerLevels,&inner,outer);
        generateReferenceQuadTessCoords
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                   &shaderWriteBarrier,SVar2,inner,iStack_3c4,outer[0],outer[1],
                   (int)stack0xfffffffffffffe50,iStack_1ac);
      }
      else {
        if (TVar24 != TESSPRIMITIVETYPE_TRIANGLES) goto LAB_0076d8f3;
        getClampedRoundedTriangleTessLevels(SVar2,pTVar10[uVar25].inner,outerLevels,&inner,outer);
        generateReferenceTriangleTessCoords
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                   &shaderWriteBarrier,SVar2,inner,outer[0],outer[1],outer[2]);
      }
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::_M_move_assign
                (allReferenceTessCoords.
                 super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar25,&shaderWriteBarrier);
      if (shaderWriteBarrier._0_8_ != 0) {
        operator_delete((void *)shaderWriteBarrier._0_8_,
                        shaderWriteBarrier._16_8_ - shaderWriteBarrier._0_8_);
      }
      uVar25 = ((long)tessLevelCases.
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)tessLevelCases.
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      bVar12 = uVar33 <= uVar25;
      lVar34 = uVar25 - uVar33;
      uVar25 = uVar33;
      uVar33 = (ulong)((int)uVar33 + 1);
    } while (bVar12 && lVar34 != 0);
  }
  device = local_5f8;
  pDVar17 = local_600;
  pvVar26 = allReferenceTessCoords.
            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1;
  pvVar28 = allReferenceTessCoords.
            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar29 = allReferenceTessCoords.
            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar26 !=
      allReferenceTessCoords.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish &&
      allReferenceTessCoords.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      allReferenceTessCoords.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pvVar29 = pvVar26;
      if ((ulong)((long)(pvVar26->
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar26->
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) <=
          (ulong)((long)(pvVar28->
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar28->
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)) {
        pvVar29 = pvVar28;
      }
      pvVar26 = pvVar26 + 1;
      pvVar28 = pvVar29;
    } while (pvVar26 !=
             allReferenceTessCoords.
             super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pVVar3 = (pvVar29->
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar4 = (pvVar29->
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  makeBufferCreateInfo((VkBufferCreateInfo *)&shaderWriteBarrier,0x18,0x20);
  tessellation::Buffer::Buffer
            (&tessLevelsBuffer,pDVar17,device,allocator,(VkBufferCreateInfo *)&shaderWriteBarrier,
             (MemoryRequirement)0x1);
  local_640 = ((long)(((ulong)((long)pVVar3 - (long)pVVar4) >> 2) * -0x5555555500000000) >> 0x1c) +
              0x110;
  makeBufferCreateInfo((VkBufferCreateInfo *)&shaderWriteBarrier,local_640,0x20);
  tessellation::Buffer::Buffer
            (&resultBuffer,pDVar17,device,allocator,(VkBufferCreateInfo *)&shaderWriteBarrier,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&shaderWriteBarrier);
  pDVar18 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&shaderWriteBarrier,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,2,(VkSampler *)0x0);
  pDVar18 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (pDVar18,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,4,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)outer,pDVar18,pDVar17,device,0);
  DStack_2e0.m_device = (VkDevice)local_1a8[0]._0_8_;
  DStack_2e0.m_allocator = (VkAllocationCallbacks *)local_1a8[0]._8_8_;
  local_2e8.m_internal._0_4_ = outer[0];
  local_2e8.m_internal._4_4_ = outer[1];
  DStack_2e0.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffe50;
  outer[0] = 0;
  outer[1] = 0;
  stack0xfffffffffffffe50 = (pointer)0x0;
  local_1a8[0]._M_allocated_capacity = (pointer)0x0;
  local_1a8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  if (shaderWriteBarrier.size != 0) {
    operator_delete((void *)shaderWriteBarrier.size,(long)local_5a8 - shaderWriteBarrier.size);
  }
  if (shaderWriteBarrier._24_8_ != 0) {
    operator_delete((void *)shaderWriteBarrier._24_8_,
                    shaderWriteBarrier.offset - shaderWriteBarrier._24_8_);
  }
  if (shaderWriteBarrier._0_8_ != 0) {
    operator_delete((void *)shaderWriteBarrier._0_8_,
                    shaderWriteBarrier._16_8_ - shaderWriteBarrier._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)outer);
  pDVar19 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)outer,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar19 = ::vk::DescriptorPoolBuilder::addType(pDVar19,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&shaderWriteBarrier,pDVar19,pDVar17,device,1,1
            );
  DStack_230.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_230.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_238.m_internal = shaderWriteBarrier._0_8_;
  DStack_230.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  if (outer._0_8_ != 0) {
    operator_delete((void *)outer._0_8_,local_1a8[0]._M_allocated_capacity - outer._0_8_);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&shaderWriteBarrier,pDVar17,device,
                    local_238,local_2e8);
  local_438 = shaderWriteBarrier.srcAccessMask;
  VStack_434 = shaderWriteBarrier.dstAccessMask;
  dStack_430 = shaderWriteBarrier.srcQueueFamilyIndex;
  dStack_42c = shaderWriteBarrier.dstQueueFamilyIndex;
  local_448 = shaderWriteBarrier._0_8_;
  plStack_440 = (long *)shaderWriteBarrier.pNext;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&shaderWriteBarrier);
  pDVar20 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&shaderWriteBarrier,(VkStructureType)local_448,
                       (void *)0x0,0);
  pDVar20 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      (pDVar20,(VkStructureType)local_448,&DAT_00000001,0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar20,pDVar17,device);
  if (shaderWriteBarrier.size != 0) {
    operator_delete((void *)shaderWriteBarrier.size,(long)local_5a8 - shaderWriteBarrier.size);
  }
  if (shaderWriteBarrier._24_8_ != 0) {
    operator_delete((void *)shaderWriteBarrier._24_8_,
                    shaderWriteBarrier.offset - shaderWriteBarrier._24_8_);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&shaderWriteBarrier);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&shaderWriteBarrier,pDVar17,device);
  renderPass = shaderWriteBarrier._0_8_;
  DStack_400.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_400.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  DStack_400.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  makeFramebufferWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&shaderWriteBarrier,pDVar17,device,
             (VkRenderPass)shaderWriteBarrier._0_8_);
  DStack_250.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_250.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_258.m_internal = shaderWriteBarrier._0_8_;
  DStack_250.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&shaderWriteBarrier,pDVar17,device,
                     local_2e8);
  pipelineLayout = shaderWriteBarrier._0_8_;
  DStack_300.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_300.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  DStack_300.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&shaderWriteBarrier,pDVar17,device,
                  (deUint32)local_648);
  DStack_270.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_270.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_278.m_internal = shaderWriteBarrier._0_8_;
  DStack_270.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&shaderWriteBarrier,pDVar17,device,
             (VkCommandPool)shaderWriteBarrier._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_628 = shaderWriteBarrier.srcAccessMask;
  VStack_624 = shaderWriteBarrier.dstAccessMask;
  dStack_620 = shaderWriteBarrier.srcQueueFamilyIndex;
  dStack_61c = shaderWriteBarrier.dstQueueFamilyIndex;
  local_638 = (VkCommandBuffer)shaderWriteBarrier._0_8_;
  plStack_630 = (long *)shaderWriteBarrier.pNext;
  memset(&shaderWriteBarrier,0,0xfc);
  local_4ec = 1;
  local_4e8 = false;
  local_4e4 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  _inner = (pointer)&local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&inner,"vert","");
  cVar21 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)&inner);
  pGVar22 = GraphicsPipelineBuilder::setShader
                      ((GraphicsPipelineBuilder *)&shaderWriteBarrier,pDVar17,device,
                       VK_SHADER_STAGE_VERTEX_BIT,*(ProgramBinary **)(cVar21._M_node + 2),
                       (VkSpecializationInfo *)0x0);
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"tesc","");
  cVar21 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,&local_688);
  pGVar22 = GraphicsPipelineBuilder::setShader
                      (pGVar22,pDVar17,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                       *(ProgramBinary **)(cVar21._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"tese","");
  cVar21 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,&local_668);
  pGVar22 = GraphicsPipelineBuilder::setShader
                      (pGVar22,pDVar17,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                       *(ProgramBinary **)(cVar21._M_node + 2),(VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)outer,pGVar22,pDVar17,device,
             (VkPipelineLayout)pipelineLayout,(VkRenderPass)renderPass);
  obj = outer._0_8_;
  DStack_290.m_device = (VkDevice)local_1a8[0]._0_8_;
  DStack_290.m_allocator = (VkAllocationCallbacks *)local_1a8[0]._8_8_;
  DStack_290.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffe50;
  outer[0] = 0;
  outer[1] = 0;
  stack0xfffffffffffffe50 = (pointer)0x0;
  local_1a8[0]._M_allocated_capacity = (pointer)0x0;
  local_1a8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_inner != &local_3b8) {
    operator_delete(_inner,(ulong)(local_3b8._M_allocated_capacity + 1));
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)&shaderWriteBarrier);
  if (tessLevelCases.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      tessLevelCases.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar33 = 0;
    uVar25 = 0;
  }
  else {
    uVar25 = 0;
    TVar24 = TESSPRIMITIVETYPE_TRIANGLES;
    do {
      shaderWriteBarrier._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      local_604 = TVar24;
      local_3d0 = uVar25;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&shaderWriteBarrier.pNext,"Tessellation levels: ",0x15);
      getTessellationLevelsString_abi_cxx11_
                ((string *)outer,
                 (tessellation *)
                 (tessLevelCases.
                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar25),
                 (TessLevels *)(ulong)this->m_primitiveType,TVar24);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&shaderWriteBarrier.pNext,(char *)outer._0_8_,
                 (long)stack0xfffffffffffffe50);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&shaderWriteBarrier,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outer._0_8_ != local_1a8) {
        operator_delete((void *)outer._0_8_,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
      std::ios_base::~ios_base(local_570);
      puVar6 = (undefined8 *)
               (tessLevelsBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr;
      puVar6[2] = *(undefined8 *)
                   (tessLevelCases.
                    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar25].outer + 2);
      uVar9 = *(undefined8 *)
               tessLevelCases.
               super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar25].outer;
      *puVar6 = *(undefined8 *)
                 tessLevelCases.
                 super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar25].inner;
      puVar6[1] = uVar9;
      local_648 = uVar25 * 3;
      ::vk::flushMappedMemoryRange
                (pDVar17,device,
                 (VkDeviceMemory)
                 ((tessLevelsBuffer.m_allocation.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_memory).m_internal,
                 (tessLevelsBuffer.m_allocation.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_offset,0x18);
      pAVar11 = resultBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      size = local_640;
      memset((resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr,0,local_640);
      ::vk::flushMappedMemoryRange
                (pDVar17,device,(VkDeviceMemory)(pAVar11->m_memory).m_internal,pAVar11->m_offset,
                 size);
      beginCommandBuffer(pDVar17,local_638);
      beginRenderPassWithRasterizationDisabled(pDVar17,local_638,(VkRenderPass)renderPass,local_258)
      ;
      (*pDVar17->_vptr_DeviceInterface[0x4c])(pDVar17,local_638,0,obj);
      (*pDVar17->_vptr_DeviceInterface[0x56])(pDVar17,local_638,0,pipelineLayout,0,1,&local_448,0,0)
      ;
      (*pDVar17->_vptr_DeviceInterface[0x59])(pDVar17,local_638,1,1,0,0);
      endRenderPass(pDVar17,local_638);
      makeBufferMemoryBarrier
                (&shaderWriteBarrier,0x40,0x2000,
                 (VkBuffer)
                 resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,0,local_640);
      (*pDVar17->_vptr_DeviceInterface[0x6d])
                (pDVar17,local_638,0x8000,0x4000,0,0,0,1,&shaderWriteBarrier,0,0);
      endCommandBuffer(pDVar17,local_638);
      submitCommandsAndWait(pDVar17,device,local_3e0,local_638);
      pAVar11 = resultBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      ::vk::invalidateMappedMemoryRange
                (pDVar17,device,
                 (VkDeviceMemory)
                 ((resultBuffer.m_allocation.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_memory).m_internal,
                 (resultBuffer.m_allocation.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_offset,local_640);
      piVar7 = (int *)pAVar11->m_hostPtr;
      iVar15 = *piVar7;
      sVar30 = (size_type)iVar15;
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
                (&resultTessCoords,sVar30,(allocator_type *)&shaderWriteBarrier);
      pvVar26 = allReferenceTessCoords.
                super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppvVar1 = &shaderWriteBarrier.pNext;
      if (0 < iVar15) {
        lVar34 = 0;
        do {
          *(int *)((long)(resultTessCoords.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar34 + 8) =
               piVar7[6];
          *(undefined8 *)
           ((long)(resultTessCoords.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar34) =
               *(undefined8 *)(piVar7 + 4);
          lVar34 = lVar34 + 0xc;
          piVar7 = piVar7 + 4;
        } while (sVar30 * 0xc != lVar34);
      }
      iVar16 = (int)((ulong)((long)(&((allReferenceTessCoords.
                                       super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish)[local_648] -
                            (long)(&((allReferenceTessCoords.
                                      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)[local_648]) >> 2);
      iVar31 = iVar16 * -0x55555555;
      log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      shaderWriteBarrier._0_8_ = log;
      if (SBORROW4(iVar15,iVar31) == iVar15 + iVar16 * 0x55555555 < 0) {
        if (iVar15 == iVar31) {
          ppvVar1 = &shaderWriteBarrier.pNext;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar1,"Note: generated ",0x10);
          std::ostream::operator<<(ppvVar1,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar1," tessellation coordinates",0x19);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&shaderWriteBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          ppvVar1 = &shaderWriteBarrier.pNext;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar1,"Note: generated ",0x10);
          std::ostream::operator<<(ppvVar1,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar1," coordinates (out of which ",0x1b);
          std::ostream::operator<<(ppvVar1,iVar31);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar1," must be unique)",0x10);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&shaderWriteBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar1,"Failure: generated ",0x13);
        std::ostream::operator<<(ppvVar1,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar1," coordinates, but the expected reference value is ",0x32);
        std::ostream::operator<<(ppvVar1,iVar31);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&shaderWriteBarrier,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
      std::ios_base::~ios_base(local_570);
      ppvVar1 = &shaderWriteBarrier.pNext;
      if (this->m_primitiveType - TESSPRIMITIVETYPE_QUADS < 2) {
        shaderWriteBarrier._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar1,
                   "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively"
                   ,0x6c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&shaderWriteBarrier,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0076e704:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
        std::ios_base::~ios_base(local_570);
      }
      else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        shaderWriteBarrier._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar1,
                   "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively"
                   ,0x78);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&shaderWriteBarrier,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_0076e704;
      }
      TVar24 = this->m_primitiveType;
      tcu::Surface::Surface(&refVisual);
      local_608 = iVar31;
      tcu::Surface::Surface(&resVisual);
      coords = &(pvVar26->
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
                _M_impl.super__Vector_impl_data._M_start + local_648;
      local_3d8 = sVar30;
      drawTessCoordVisualization
                (&refVisual,TVar24,
                 (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)coords);
      drawTessCoordVisualization(&resVisual,TVar24,&resultTessCoords);
      shaderWriteBarrier.sType = 0xffff0000;
      bVar12 = oneWayComparePointSets
                         (log,&refVisual,TVar24,
                          (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          coords,&resultTessCoords,"reference","result",(RGBA *)&shaderWriteBarrier)
      ;
      shaderWriteBarrier.sType = 0xff0000ff;
      bVar13 = oneWayComparePointSets
                         (log,&resVisual,TVar24,&resultTessCoords,
                          (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          coords,"result","reference",(RGBA *)&shaderWriteBarrier);
      device = local_5f8;
      if (!bVar12 || !bVar13) {
        outer._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(outer + 2));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(outer + 2),
                   "Note: in the following reference visualization, points that are missing in result point set are blue (if any)"
                   ,0x6d);
        pTVar23 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)outer,(EndMessageToken *)&tcu::TestLog::EndMessage);
        local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
        local_668._M_dataplus._M_p = (pointer)0x19;
        local_688._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_688,(ulong)&local_668);
        local_688.field_2._M_allocated_capacity = (size_type)local_668._M_dataplus._M_p;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 9) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 10) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0xb) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0xc) = 'V';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0xd) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0xe) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0xf) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0x10) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0x11) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0x12) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0x13) = 'z';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0x14) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0x15) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0x16) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0x17) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0x18) = 'n';
        *(undefined8 *)local_688._M_dataplus._M_p = 0x4373736554666552;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 8) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 9) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 10) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0xb) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0xc) = 'V';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0xd) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0xe) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p + 0xf) = 'u';
        local_688._M_string_length = (size_type)local_668._M_dataplus._M_p;
        local_688._M_dataplus._M_p[(long)local_668._M_dataplus._M_p] = '\0';
        local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
        local_5f0 = 0x21;
        local_668._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_668,(ulong)&local_5f0);
        local_668.field_2._M_allocated_capacity = local_5f0;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x10) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x11) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x12) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x13) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x14) = 'v';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x15) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x16) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x17) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x18) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x19) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x1a) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x1b) = 'z';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x1c) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x1d) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x1e) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0x1f) = 'o';
        *(undefined8 *)local_668._M_dataplus._M_p = 0x636e657265666552;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 8) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 9) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 10) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0xb) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0xc) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0xd) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0xe) = 'C';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p + 0xf) = 'o';
        local_668._M_dataplus._M_p[0x20] = 'n';
        local_668._M_string_length = local_5f0;
        local_668._M_dataplus._M_p[local_5f0] = '\0';
        pSVar27 = &refVisual;
        tcu::LogImage::LogImage
                  ((LogImage *)&inner,&local_688,&local_668,pSVar27,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&inner,(int)pTVar23,__buf,(size_t)pSVar27);
        ppvVar1 = &shaderWriteBarrier.pNext;
        shaderWriteBarrier._0_8_ = pTVar23;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar1,
                   "Note: in the following result visualization, points that are missing in reference point set are red (if any)"
                   ,0x6c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&shaderWriteBarrier,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
        std::ios_base::~ios_base(local_570);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_p != local_398) {
          operator_delete(local_3a8._M_p,local_398[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_inner != &local_3b8) {
          operator_delete(_inner,(ulong)(local_3b8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_668._M_dataplus._M_p != &local_668.field_2) {
          operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_688._M_dataplus._M_p != &local_688.field_2) {
          operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(outer + 2));
        std::ios_base::~ios_base(local_140);
      }
      outer._0_8_ = local_1a8;
      _inner = (pointer)0x19;
      outer._0_8_ = std::__cxx11::string::_M_create((ulong *)outer,(ulong)&inner);
      local_1a8[0]._M_allocated_capacity = _inner;
      builtin_strncpy((char *)outer._0_8_,"ResTessCoordVisualization",0x19);
      stack0xfffffffffffffe50 = (pointer)_inner;
      *(char *)(outer._0_8_ + (long)_inner) = '\0';
      _inner = (pointer)&local_3b8;
      local_688._M_dataplus._M_p = (pointer)0x1e;
      _inner = (pointer)std::__cxx11::string::_M_create((ulong *)&inner,(ulong)&local_688);
      local_3b8._M_allocated_capacity = (size_type)local_688._M_dataplus._M_p;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xe) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xf) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x10) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x11) = 'v';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x12) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x13) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x14) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x15) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x16) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x17) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x18) = 'z';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x19) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1a) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1b) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1c) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1d) = 'n';
      *(undefined8 *)_inner = 0x7420746c75736552;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 8) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 9) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 10) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xb) = 'C';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xc) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xd) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xe) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xf) = 'd';
      local_3c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688._M_dataplus._M_p;
      _inner[(long)local_688._M_dataplus._M_p] = '\0';
      pSVar27 = &resVisual;
      tcu::LogImage::LogImage
                ((LogImage *)&shaderWriteBarrier,(string *)outer,(string *)&inner,pSVar27,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&shaderWriteBarrier,(int)log,__buf_00,(size_t)pSVar27);
      sVar30 = local_3d8;
      if ((VkDeviceSize *)shaderWriteBarrier.buffer.m_internal != &shaderWriteBarrier.size) {
        operator_delete((void *)shaderWriteBarrier.buffer.m_internal,shaderWriteBarrier.size + 1);
      }
      if ((VkAccessFlags *)shaderWriteBarrier._0_8_ != &shaderWriteBarrier.srcAccessMask) {
        operator_delete((void *)shaderWriteBarrier._0_8_,shaderWriteBarrier._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_inner != &local_3b8) {
        operator_delete(_inner,(ulong)(local_3b8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outer._0_8_ != local_1a8) {
        operator_delete((void *)outer._0_8_,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
      }
      bVar8 = local_608 <= (int)sVar30;
      tcu::Surface::~Surface(&resVisual);
      tcu::Surface::~Surface(&refVisual);
      uVar25 = local_3d0;
      if (resultTessCoords.
          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(resultTessCoords.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)resultTessCoords.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)resultTessCoords.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      TVar24 = local_604 + (bVar8 && (bVar12 && bVar13));
      uVar25 = (ulong)((int)uVar25 + 1);
      uVar33 = ((long)tessLevelCases.
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)tessLevelCases.
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      pDVar17 = local_600;
    } while (uVar25 <= uVar33 && uVar33 - uVar25 != 0);
    uVar25 = (ulong)TVar24;
  }
  if (uVar33 == uVar25) {
    shaderWriteBarrier._0_8_ = &shaderWriteBarrier.srcAccessMask;
    std::__cxx11::string::_M_construct<char_const*>((string *)&shaderWriteBarrier,"OK","");
    local_610->m_code = QP_TEST_RESULT_PASS;
    (local_610->m_description)._M_dataplus._M_p = (pointer)&(local_610->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_610->m_description,shaderWriteBarrier._0_8_,
               (long)shaderWriteBarrier.pNext + shaderWriteBarrier._0_8_);
  }
  else {
    shaderWriteBarrier._0_8_ = &shaderWriteBarrier.srcAccessMask;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&shaderWriteBarrier,"Some cases have failed","");
    local_610->m_code = QP_TEST_RESULT_FAIL;
    (local_610->m_description)._M_dataplus._M_p = (pointer)&(local_610->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_610->m_description,shaderWriteBarrier._0_8_,
               (long)shaderWriteBarrier.pNext + shaderWriteBarrier._0_8_);
  }
  if ((VkAccessFlags *)shaderWriteBarrier._0_8_ != &shaderWriteBarrier.srcAccessMask) {
    operator_delete((void *)shaderWriteBarrier._0_8_,shaderWriteBarrier._16_8_ + 1);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_290,(VkPipeline)obj);
  }
  if (local_638 != (VkCommandBuffer)0x0) {
    outer._0_8_ = local_638;
    (**(code **)(*plStack_630 + 0x240))(plStack_630,_local_628,_dStack_620,1);
  }
  if (local_278.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_270,local_278);
  }
  if (pipelineLayout != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_300,(VkPipelineLayout)pipelineLayout);
  }
  if (local_258.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_250,local_258);
  }
  if (renderPass != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_400,(VkRenderPass)renderPass);
  }
  if (local_448 != 0) {
    outer[0] = (undefined4)local_448;
    outer[1] = local_448._4_4_;
    (**(code **)(*plStack_440 + 0x1e8))(plStack_440,_local_438,_dStack_430,1);
  }
  if (local_238.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_230,local_238);
  }
  if (local_2e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_2e0,local_2e8);
  }
  if (resultBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(resultBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (tessLevelsBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(tessLevelsBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    tessLevelsBuffer.m_allocation.
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  if (tessLevelsBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
      m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&tessLevelsBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                deleter,(VkBuffer)
                        tessLevelsBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                        m_data.object.m_internal);
  }
  std::
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  ::~vector(&allReferenceTessCoords);
  if (tessLevelCases.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tessLevelCases.
                    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)tessLevelCases.
                          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tessLevelCases.
                          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_610;
}

Assistant:

tcu::TestStatus TessCoordTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Test data

	const std::vector<TessLevels>		 tessLevelCases			= genTessLevelCases(m_primitiveType, m_spacingMode);
	std::vector<std::vector<tcu::Vec3> > allReferenceTessCoords	(tessLevelCases.size());

	for (deUint32 i = 0; i < tessLevelCases.size(); ++i)
		allReferenceTessCoords[i] = generateReferenceTessCoords(m_primitiveType, m_spacingMode, &tessLevelCases[i].inner[0], &tessLevelCases[i].outer[0]);

	const size_t maxNumVertices = static_cast<int>(std::max_element(allReferenceTessCoords.begin(), allReferenceTessCoords.end(), SizeLessThan<std::vector<tcu::Vec3> >())->size());

	// Input buffer: tessellation levels. Data is filled in later.

	const Buffer tessLevelsBuffer(vk, device, allocator,
		makeBufferCreateInfo(sizeof(TessLevels), VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Output buffer: number of invocations + padding + tessellation coordinates. Initialized later.

	const int          resultBufferTessCoordsOffset	 = 4 * (int)sizeof(deInt32);
	const int          extraneousVertices			 = 16;	// allow some room for extraneous vertices from duplicate shader invocations (number is arbitrary)
	const VkDeviceSize resultBufferSizeBytes		 = resultBufferTessCoordsOffset + (maxNumVertices + extraneousVertices)*sizeof(tcu::Vec4);
	const Buffer       resultBuffer					 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo tessLevelsBufferInfo = makeDescriptorBufferInfo(tessLevelsBuffer.get(), 0ull, sizeof(TessLevels));
	const VkDescriptorBufferInfo resultBufferInfo     = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &tessLevelsBufferInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline: set up vertex processing without rasterization

	const Unique<VkRenderPass>		renderPass		(makeRenderPassWithoutAttachments (vk, device));
	const Unique<VkFramebuffer>		framebuffer		(makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool			(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setShader(vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), DE_NULL)
		.build    (vk, device, *pipelineLayout, *renderPass));

	deUint32 numPassedCases = 0;

	// Repeat the test for all tessellation coords cases
	for (deUint32 tessLevelCaseNdx = 0; tessLevelCaseNdx < tessLevelCases.size(); ++tessLevelCaseNdx)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Tessellation levels: " << getTessellationLevelsString(tessLevelCases[tessLevelCaseNdx], m_primitiveType)
			<< tcu::TestLog::EndMessage;

		// Upload tessellation levels data to the input buffer
		{
			const Allocation& alloc = tessLevelsBuffer.getAllocation();
			TessLevels* const bufferTessLevels = static_cast<TessLevels*>(alloc.getHostPtr());
			*bufferTessLevels = tessLevelCases[tessLevelCaseNdx];
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(TessLevels));
		}

		// Clear the results buffer
		{
			const Allocation& alloc = resultBuffer.getAllocation();
			deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
		}

		// Reset the command buffer and begin recording.
		beginCommandBuffer(vk, *cmdBuffer);
		beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		// Process a single abstract vertex.
		vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		{
			const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify results
		{
			const Allocation& resultAlloc = resultBuffer.getAllocation();
			invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

			const deInt32					numResults			= *static_cast<deInt32*>(resultAlloc.getHostPtr());
			const std::vector<tcu::Vec3>	resultTessCoords    = readInterleavedData<tcu::Vec3>(numResults, resultAlloc.getHostPtr(), resultBufferTessCoordsOffset, sizeof(tcu::Vec4));
			const std::vector<tcu::Vec3>&	referenceTessCoords = allReferenceTessCoords[tessLevelCaseNdx];
			const int						numExpectedResults  = static_cast<int>(referenceTessCoords.size());
			tcu::TestLog&					log					= m_context.getTestContext().getLog();

			if (numResults < numExpectedResults)
			{
				log << tcu::TestLog::Message
					<< "Failure: generated " << numResults << " coordinates, but the expected reference value is " << numExpectedResults
					<< tcu::TestLog::EndMessage;
			}
			else if (numResults == numExpectedResults)
				log << tcu::TestLog::Message << "Note: generated " << numResults << " tessellation coordinates" << tcu::TestLog::EndMessage;
			else
			{
				log << tcu::TestLog::Message
					<< "Note: generated " << numResults << " coordinates (out of which " << numExpectedResults << " must be unique)"
					<< tcu::TestLog::EndMessage;
			}

			if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
				log << tcu::TestLog::Message << "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively" << tcu::TestLog::EndMessage;
			else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS || m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				log << tcu::TestLog::Message << "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively" << tcu::TestLog::EndMessage;
			else
				DE_ASSERT(false);

			if (compareTessCoords(log, m_primitiveType, referenceTessCoords, resultTessCoords) && (numResults >= numExpectedResults))
				++numPassedCases;
		}
	}  // for tessLevelCaseNdx

	return (numPassedCases == tessLevelCases.size() ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Some cases have failed"));
}